

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::WriteNode(ColladaExporter *this,aiScene *pScene,aiNode *pNode)

{
  undefined1 *this_00;
  string *psVar1;
  string *psVar2;
  aiMesh *mesh;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  aiBone *paVar6;
  aiBone *paVar7;
  aiNode *paVar8;
  size_t i;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t a;
  long lVar12;
  string node_id;
  aiMatrix4x4 sourceView;
  string node_name;
  aiMatrix4x4 mat;
  aiMatrix4x4t<float> temp;
  allocator<char> local_301;
  string *local_300;
  aiScene *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  undefined1 local_2b0 [32];
  undefined8 uStack_290;
  float local_288;
  float local_284;
  float fStack_280;
  float fStack_27c;
  float fStack_278;
  float local_274;
  ulong local_270;
  aiMatrix4x4t<float> local_268;
  string local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_78 [72];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_208);
    poVar5 = std::operator<<((ostream *)(local_208 + 0x10),"Node_");
    std::ostream::_M_insert<void_const*>(poVar5);
    std::__cxx11::stringbuf::str();
    uVar9 = CONCAT44(local_2b0._12_4_,local_2b0._8_4_);
    if (uVar9 < 0x400) {
      (pNode->mName).length = local_2b0._8_4_;
      memcpy((pNode->mName).data,(void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_),uVar9);
      (pNode->mName).data[uVar9] = '\0';
    }
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
  }
  pcVar10 = (pNode->mName).data;
  paVar6 = findBone(pScene,pcVar10);
  local_2f8 = pScene;
  if (paVar6 == (aiBone *)0x0) {
    pcVar11 = "NODE";
LAB_0032eec2:
    bVar3 = false;
  }
  else {
    if (pNode->mParent != (aiNode *)0x0) {
      paVar7 = findBone(pScene,(pNode->mParent->mName).data);
      if (paVar7 != (aiBone *)0x0) {
        pcVar11 = "JOINT";
        goto LAB_0032eec2;
      }
    }
    bVar3 = true;
    pcVar11 = "JOINT";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar10,(allocator<char> *)local_2b0);
  XMLIDEncode(&local_2d0,(string *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar10,(allocator<char> *)local_2b0);
  XMLEscape(&local_228,(string *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  this_00 = &this->field_0x38;
  psVar1 = &this->startstr;
  poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
  std::operator<<(poVar5,"<node ");
  if (bVar3) {
    poVar5 = std::operator<<((ostream *)this_00,"id=\"");
    poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
    poVar5 = std::operator<<(poVar5,"\" ");
    if (paVar6 == (aiBone *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,"",(allocator<char> *)&local_2f0);
    }
    else {
      std::operator+(&local_2f0,"sid=\"",&local_2d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2f0,"\"");
    }
    std::operator<<(poVar5,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    if (paVar6 != (aiBone *)0x0) {
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFoundSkeletonRootNodeID);
  }
  else {
    poVar5 = std::operator<<((ostream *)this_00,"id=\"");
    poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
    poVar5 = std::operator<<(poVar5,"\" ");
    if (paVar6 == (aiBone *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,"",(allocator<char> *)&local_2f0);
    }
    else {
      std::operator+(&local_2f0,"sid=\"",&local_2d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2f0,"\"");
    }
    std::operator<<(poVar5,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    if (paVar6 != (aiBone *)0x0) {
      std::__cxx11::string::~string((string *)&local_2f0);
    }
  }
  poVar5 = std::operator<<((ostream *)this_00," name=\"");
  poVar5 = std::operator<<(poVar5,(string *)&local_228);
  poVar5 = std::operator<<(poVar5,"\" type=\"");
  poVar5 = std::operator<<(poVar5,pcVar11);
  poVar5 = std::operator<<(poVar5,"\">");
  psVar2 = &this->endstr;
  std::operator<<(poVar5,(string *)psVar2);
  PushTag(this);
  local_208._0_8_ = *(undefined8 *)&pNode->mTransformation;
  local_208._8_4_ = (pNode->mTransformation).a3;
  local_208._12_4_ = (pNode->mTransformation).a4;
  local_1f8._M_allocated_capacity._0_4_ = (pNode->mTransformation).b1;
  local_1f8._M_allocated_capacity._4_4_ = (pNode->mTransformation).b2;
  local_1f8._8_4_ = (pNode->mTransformation).b3;
  local_1f8._12_4_ = (pNode->mTransformation).b4;
  local_1e8 = (pNode->mTransformation).c1;
  fStack_1e4 = (pNode->mTransformation).c2;
  fStack_1e0 = (pNode->mTransformation).c3;
  fStack_1dc = (pNode->mTransformation).c4;
  local_1d8 = (pNode->mTransformation).d1;
  fStack_1d4 = (pNode->mTransformation).d2;
  fStack_1d0 = (pNode->mTransformation).d3;
  fStack_1cc = (pNode->mTransformation).d4;
  for (uVar9 = 0; uVar9 < this->mScene->mNumCameras; uVar9 = uVar9 + 1) {
    bVar3 = aiString::operator==(&this->mScene->mCameras[uVar9]->mName,&pNode->mName);
    if (bVar3) {
      local_2b0._0_4_ = 1.0;
      local_2b0._4_4_ = 0.0;
      local_2b0._8_4_ = 0.0;
      local_2b0._12_4_ = 0.0;
      local_2b0._16_4_ = 0.0;
      local_2b0._20_4_ = 1.0;
      local_2b0._24_4_ = 0.0;
      local_2b0._28_4_ = 0.0;
      uStack_290._0_4_ = 0.0;
      uStack_290._4_4_ = 0.0;
      local_288 = 1.0;
      local_284 = 0.0;
      fStack_280 = 0.0;
      fStack_27c = 0.0;
      fStack_278 = 0.0;
      local_274 = 1.0;
      aiCamera::GetCameraMatrix(this->mScene->mCameras[uVar9],(aiMatrix4x4 *)local_2b0);
      local_268.a2 = 0.0;
      local_268.a3 = 0.0;
      local_268.a4 = 0.0;
      local_268.b1 = 0.0;
      local_268.b2 = 1.0;
      local_268.b3 = 0.0;
      local_268.b4 = 0.0;
      local_268.c1 = 0.0;
      local_268.c2 = 0.0;
      local_268.c4 = 0.0;
      local_268.d1 = 0.0;
      local_268.d2 = 0.0;
      local_268.d3 = 0.0;
      local_268.d4 = 1.0;
      local_268.c3 = -1.0;
      local_268.a1 = -1.0;
      local_78._0_8_ = CONCAT44(local_2b0._4_4_,local_2b0._0_4_);
      local_78._8_8_ = CONCAT44(local_2b0._12_4_,local_2b0._8_4_);
      local_78._16_8_ = CONCAT44(local_2b0._20_4_,local_2b0._16_4_);
      local_78._44_4_ = local_284;
      local_78._40_4_ = local_288;
      local_78._52_4_ = fStack_27c;
      local_78._48_4_ = fStack_280;
      local_78._60_4_ = local_274;
      local_78._56_4_ = fStack_278;
      local_78._32_4_ = (float)uStack_290;
      local_78._36_4_ = uStack_290._4_4_;
      local_78._24_8_ = local_2b0._24_8_;
      aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)local_78,&local_268);
      aiMatrix4x4t<float>::operator*=
                ((aiMatrix4x4t<float> *)local_208,(aiMatrix4x4t<float> *)local_78);
      break;
    }
  }
  poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
  std::operator<<(poVar5,"<matrix sid=\"matrix\">");
  poVar5 = (ostream *)std::ostream::operator<<(this_00,(float)local_208._0_4_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_208._4_4_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_208._8_4_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_208._12_4_);
  std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(this_00,(float)local_1f8._M_allocated_capacity._0_4_)
  ;
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_1f8._M_allocated_capacity._4_4_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_1f8._8_4_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_1f8._12_4_);
  std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(this_00,local_1e8);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_1e4);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_1e0);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_1dc);
  std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(this_00,local_1d8);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_1d4);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fStack_1d0);
  poVar5 = std::operator<<(poVar5," ");
  std::ostream::operator<<(poVar5,fStack_1cc);
  poVar5 = std::operator<<((ostream *)this_00,"</matrix>");
  std::operator<<(poVar5,(string *)psVar2);
  uVar4 = pNode->mNumMeshes;
  if (uVar4 == 0) {
    uVar9 = 0;
    do {
      if (this->mScene->mNumCameras <= uVar9) goto LAB_0032f972;
      bVar3 = aiString::operator==(&this->mScene->mCameras[uVar9]->mName,&pNode->mName);
      uVar9 = uVar9 + 1;
    } while (!bVar3);
    poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar5 = std::operator<<(poVar5,"<instance_camera url=\"#");
    poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
    poVar5 = std::operator<<(poVar5,"-camera\"/>");
    std::operator<<(poVar5,(string *)psVar2);
LAB_0032f972:
    uVar9 = 0;
    do {
      if (this->mScene->mNumLights <= uVar9) goto LAB_0032f9e1;
      bVar3 = aiString::operator==(&this->mScene->mLights[uVar9]->mName,&pNode->mName);
      uVar9 = uVar9 + 1;
    } while (!bVar3);
    poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
    poVar5 = std::operator<<(poVar5,"<instance_light url=\"#");
    poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
    poVar5 = std::operator<<(poVar5,"-light\"/>");
    std::operator<<(poVar5,(string *)psVar2);
  }
  else {
    local_300 = (string *)&this->mFoundSkeletonRootNodeID;
    uVar9 = 0;
    while (uVar9 < uVar4) {
      mesh = this->mScene->mMeshes[pNode->mMeshes[uVar9]];
      local_270 = uVar9;
      if ((mesh->mNumFaces != 0) && (mesh->mNumVertices != 0)) {
        if ((mesh->mName).length == 0) {
          GetMeshId_abi_cxx11_((string *)local_2b0,this,(ulong)pNode->mMeshes[uVar9]);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_2b0,(mesh->mName).data,(allocator<char> *)&local_268);
        }
        if (mesh->mNumBones == 0) {
          poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
          poVar5 = std::operator<<(poVar5,"<instance_geometry url=\"#");
          XMLIDEncode((string *)&local_268,(string *)local_2b0);
          poVar5 = std::operator<<(poVar5,(string *)&local_268);
          poVar5 = std::operator<<(poVar5,"\">");
          std::operator<<(poVar5,(string *)psVar2);
          std::__cxx11::string::~string((string *)&local_268);
          PushTag(this);
        }
        else {
          poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
          poVar5 = std::operator<<(poVar5,"<instance_controller url=\"#");
          XMLIDEncode((string *)&local_268,(string *)local_2b0);
          poVar5 = std::operator<<(poVar5,(string *)&local_268);
          poVar5 = std::operator<<(poVar5,"-skin\">");
          std::operator<<(poVar5,(string *)psVar2);
          std::__cxx11::string::~string((string *)&local_268);
          PushTag(this);
          paVar8 = findSkeletonRootNode(local_2f8,mesh);
          if (paVar8 != (aiNode *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_78,(paVar8->mName).data,&local_301);
            XMLIDEncode((string *)&local_268,(string *)local_78);
            std::__cxx11::string::_M_assign(local_300);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)local_78);
          }
          poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
          poVar5 = std::operator<<(poVar5,"<skeleton>#");
          poVar5 = std::operator<<(poVar5,local_300);
          poVar5 = std::operator<<(poVar5,"</skeleton>");
          std::operator<<(poVar5,(string *)psVar2);
        }
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"<bind_material>");
        std::operator<<(poVar5,(string *)psVar2);
        PushTag(this);
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"<technique_common>");
        std::operator<<(poVar5,(string *)psVar2);
        PushTag(this);
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"<instance_material symbol=\"defaultMaterial\" target=\"#");
        XMLIDEncode((string *)&local_268,
                    &(this->materials).
                     super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start[mesh->mMaterialIndex].name);
        poVar5 = std::operator<<(poVar5,(string *)&local_268);
        poVar5 = std::operator<<(poVar5,"\">");
        std::operator<<(poVar5,(string *)psVar2);
        std::__cxx11::string::~string((string *)&local_268);
        PushTag(this);
        for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
          if ((mesh->mTextureCoords[lVar12] != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) {
            poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
            poVar5 = std::operator<<(poVar5,"<bind_vertex_input semantic=\"CHANNEL");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,"\" input_semantic=\"TEXCOORD\" input_set=\"");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,"\"/>");
            std::operator<<(poVar5,(string *)psVar2);
          }
        }
        PopTag(this);
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"</instance_material>");
        std::operator<<(poVar5,(string *)psVar2);
        PopTag(this);
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"</technique_common>");
        std::operator<<(poVar5,(string *)psVar2);
        PopTag(this);
        poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
        poVar5 = std::operator<<(poVar5,"</bind_material>");
        std::operator<<(poVar5,(string *)psVar2);
        PopTag(this);
        if (mesh->mNumBones == 0) {
          poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
          pcVar10 = "</instance_geometry>";
        }
        else {
          poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
          pcVar10 = "</instance_controller>";
        }
        poVar5 = std::operator<<(poVar5,pcVar10);
        std::operator<<(poVar5,(string *)psVar2);
        std::__cxx11::string::~string((string *)local_2b0);
        uVar4 = pNode->mNumMeshes;
      }
      uVar9 = local_270 + 1;
    }
  }
LAB_0032f9e1:
  for (uVar9 = 0; uVar9 < pNode->mNumChildren; uVar9 = uVar9 + 1) {
    WriteNode(this,local_2f8,pNode->mChildren[uVar9]);
  }
  PopTag(this);
  poVar5 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar5 = std::operator<<(poVar5,"</node>");
  std::operator<<(poVar5,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_2d0);
  return;
}

Assistant:

void ColladaExporter::WriteNode( const aiScene* pScene, aiNode* pNode)
{
    // the node must have a name
    if (pNode->mName.length == 0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }

    // If the node is associated with a bone, it is a joint node (JOINT)
    // otherwise it is a normal node (NODE)
    const char * node_type;
    bool is_joint, is_skeleton_root = false;
    if (nullptr == findBone(pScene, pNode->mName.C_Str())) {
        node_type = "NODE";
        is_joint = false;
    } else {
        node_type = "JOINT";
        is_joint = true;
        if (!pNode->mParent || nullptr == findBone(pScene, pNode->mParent->mName.C_Str())) {
            is_skeleton_root = true;
        }
    }

    const std::string node_id = XMLIDEncode(pNode->mName.data);
    const std::string node_name = XMLEscape(pNode->mName.data);
	mOutput << startstr << "<node ";
	if(is_skeleton_root) {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"" : "") ; // For now, only support one skeleton in a scene.
		mFoundSkeletonRootNodeID = node_id;
	} else {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"": "") ;
	}
	
    mOutput << " name=\"" << node_name
            << "\" type=\"" << node_type
            << "\">" << endstr;
    PushTag();

    // write transformation - we can directly put the matrix there
    // TODO: (thom) decompose into scale - rot - quad to allow addressing it by animations afterwards
    aiMatrix4x4 mat = pNode->mTransformation;

    // If this node is a Camera node, the camera coordinate system needs to be multiplied in.
    // When importing from Collada, the mLookAt is set to 0, 0, -1, and the node transform is unchanged.
    // When importing from a different format, mLookAt is set to 0, 0, 1. Therefore, the local camera
    // coordinate system must be changed to matche the Collada specification.
    for (size_t i = 0; i<mScene->mNumCameras; i++){
        if (mScene->mCameras[i]->mName == pNode->mName){
            aiMatrix4x4 sourceView;
            mScene->mCameras[i]->GetCameraMatrix(sourceView);

            aiMatrix4x4 colladaView;
            colladaView.a1 = colladaView.c3 = -1; // move into -z space.
            mat *= (sourceView * colladaView);
            break;
        }
    }
	
	// customized, sid should be 'matrix' to match with loader code.
    //mOutput << startstr << "<matrix sid=\"transform\">";
	mOutput << startstr << "<matrix sid=\"matrix\">";
	
    mOutput << mat.a1 << " " << mat.a2 << " " << mat.a3 << " " << mat.a4 << " ";
    mOutput << mat.b1 << " " << mat.b2 << " " << mat.b3 << " " << mat.b4 << " ";
    mOutput << mat.c1 << " " << mat.c2 << " " << mat.c3 << " " << mat.c4 << " ";
    mOutput << mat.d1 << " " << mat.d2 << " " << mat.d3 << " " << mat.d4;
    mOutput << "</matrix>" << endstr;

    if(pNode->mNumMeshes==0){
        //check if it is a camera node
        for(size_t i=0; i<mScene->mNumCameras; i++){
            if(mScene->mCameras[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_camera url=\"#" << node_id << "-camera\"/>" << endstr;
                break;
            }
        }
        //check if it is a light node
        for(size_t i=0; i<mScene->mNumLights; i++){
            if(mScene->mLights[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_light url=\"#" << node_id << "-light\"/>" << endstr;
                break;
            }
        }

    }else
    // instance every geometry
    for( size_t a = 0; a < pNode->mNumMeshes; ++a )
    {
        const aiMesh* mesh = mScene->mMeshes[pNode->mMeshes[a]];
        // do not instantiate mesh if empty. I wonder how this could happen
        if( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
            continue;

        const std::string meshName = mesh->mName.length == 0 ? GetMeshId(pNode->mMeshes[a]) : mesh->mName.C_Str();

        if( mesh->mNumBones == 0 )
        {
            mOutput << startstr << "<instance_geometry url=\"#" << XMLIDEncode(meshName) << "\">" << endstr;
            PushTag();
        }
        else
        {
            mOutput << startstr
                    << "<instance_controller url=\"#" << XMLIDEncode(meshName) << "-skin\">"
                    << endstr;
            PushTag();

			// note! this mFoundSkeletonRootNodeID some how affects animation, it makes the mesh attaches to armature skeleton root node.
			// use the first bone to find skeleton root
			const aiNode * skeletonRootBoneNode = findSkeletonRootNode( pScene, mesh );
			if ( skeletonRootBoneNode ) {
				mFoundSkeletonRootNodeID = XMLIDEncode( skeletonRootBoneNode->mName.C_Str() );
			}
            mOutput << startstr << "<skeleton>#" << mFoundSkeletonRootNodeID << "</skeleton>" << endstr;
        }
        mOutput << startstr << "<bind_material>" << endstr;
        PushTag();
        mOutput << startstr << "<technique_common>" << endstr;
        PushTag();
        mOutput << startstr << "<instance_material symbol=\"defaultMaterial\" target=\"#" << XMLIDEncode(materials[mesh->mMaterialIndex].name) << "\">" << endstr;
        PushTag();
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords( static_cast<unsigned int>(a) ) )
                // semantic       as in <texture texcoord=...>
                // input_semantic as in <input semantic=...>
                // input_set      as in <input set=...>
                mOutput << startstr << "<bind_vertex_input semantic=\"CHANNEL" << a << "\" input_semantic=\"TEXCOORD\" input_set=\"" << a << "\"/>" << endstr;
        }
        PopTag();
        mOutput << startstr << "</instance_material>" << endstr;
        PopTag();
        mOutput << startstr << "</technique_common>" << endstr;
        PopTag();
        mOutput << startstr << "</bind_material>" << endstr;
        
        PopTag();
        if( mesh->mNumBones == 0)
            mOutput << startstr << "</instance_geometry>" << endstr;
        else
            mOutput << startstr << "</instance_controller>" << endstr;
    }

    // recurse into subnodes
    for( size_t a = 0; a < pNode->mNumChildren; ++a )
        WriteNode( pScene, pNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</node>" << endstr;
}